

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O1

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMaski
          (BlendMaskStateMachine *this,int idx,GLboolean r,GLboolean g,GLboolean b,GLboolean a)

{
  pointer pBVar1;
  
  (*this->gl->colorMaski)(idx,r,g,b,a);
  pBVar1 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar1[idx].mask_r = r;
  pBVar1[idx].mask_g = g;
  pBVar1[idx].mask_b = b;
  pBVar1[idx].mask_a = a;
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMaski(int idx, glw::GLboolean r, glw::GLboolean g,
																  glw::GLboolean b, glw::GLboolean a)
{
	gl.colorMaski(idx, r, g, b, a);
	state[idx].mask_r = r;
	state[idx].mask_g = g;
	state[idx].mask_b = b;
	state[idx].mask_a = a;
}